

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

bool __thiscall smf::MidiFile::readBase64(MidiFile *this,string *base64data)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *__buf;
  string local_1c0;
  stringstream local_1a0 [8];
  stringstream stream;
  ostream local_190 [376];
  string *local_18;
  string *base64data_local;
  MidiFile *this_local;
  
  local_18 = base64data;
  base64data_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  base64Decode(&local_1c0,this,local_18);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  sVar1 = read(this,(int)local_1a0,__buf,in_RCX);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return (bool)((byte)sVar1 & 1);
}

Assistant:

bool MidiFile::readBase64(const std::string& base64data) {
	std::stringstream stream;
	stream << MidiFile::base64Decode(base64data);
	return MidiFile::read(stream);
}